

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

errr run_parse_ui_entry(parser *p)

{
  wchar_t wVar1;
  wchar_t local_20;
  wchar_t i;
  errr result;
  parser *p_local;
  
  p_local._4_4_ = parse_file(p,"ui_entry_base");
  if (p_local._4_4_ == 0) {
    wVar1 = hatch_last_embryo(p);
    if (wVar1 == L'\0') {
      for (local_20 = L'\0'; local_20 < n_entry; local_20 = local_20 + L'\x01') {
        entries[local_20]->flags = entries[local_20]->flags | 0x100000;
      }
      p_local._4_4_ = parse_file(p,"ui_entry");
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

static errr run_parse_ui_entry(struct parser *p)
{
	errr result = parse_file(p, "ui_entry_base");
	int i;

	if (result != 0) {
		return result;
	}
	if (hatch_last_embryo(p)) {
		return 1;
	}
	/*
	 * Mark those as templates only so they'll never be directly displayed.
	 */
	for (i = 0; i < n_entry; ++i) {
		entries[i]->flags |= ENTRY_FLAG_TEMPLATE_ONLY;
	}
	return parse_file(p, "ui_entry");
}